

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psarrst.c
# Opt level: O0

void cf2_arrstack_finalize(CF2_ArrStack arrstack)

{
  FT_Memory memory;
  CF2_ArrStack arrstack_local;
  
  arrstack->allocated = 0;
  arrstack->count = 0;
  arrstack->totalSize = 0;
  ft_mem_free(arrstack->memory,arrstack->ptr);
  arrstack->ptr = (void *)0x0;
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  cf2_arrstack_finalize( CF2_ArrStack  arrstack )
  {
    FT_Memory  memory = arrstack->memory;     /* for FT_FREE */


    FT_ASSERT( arrstack );

    arrstack->allocated = 0;
    arrstack->count     = 0;
    arrstack->totalSize = 0;

    /* free the data buffer */
    FT_FREE( arrstack->ptr );
  }